

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::Output::stopStep(Output *this,Summary *s)

{
  bool bVar1;
  int iVar2;
  Model *pMVar3;
  SharedContext *pSVar4;
  Summary *in_RSI;
  Summary *in_RDI;
  Model m;
  Summary *in_stack_ffffffffffffffb8;
  undefined1 local_38 [32];
  uint local_18;
  Summary *local_10;
  
  local_10 = in_RSI;
  pMVar3 = ClaspFacade::Summary::model(in_RDI);
  if ((pMVar3 == (Model *)0x0) || (((ulong)in_RDI->satTime & 0x100000000000000) == 0)) {
    iVar2 = modelQ((Output *)in_RDI);
    if ((iVar2 == 0) &&
       (((pMVar3 = ClaspFacade::Summary::model(in_RDI), pMVar3 != (Model *)0x0 &&
         (pMVar3 = ClaspFacade::Summary::model(in_RDI),
         (*(uint *)&pMVar3->field_0x20 >> 0x1d & 1) != 0)) &&
        (pMVar3 = ClaspFacade::Summary::model(in_RDI),
        (*(uint *)&pMVar3->field_0x20 >> 0x1b & 1) == 0)))) {
      pSVar4 = ClaspFacade::Summary::ctx(local_10);
      in_stack_ffffffffffffffb8 = (Summary *)&pSVar4->output;
      pMVar3 = ClaspFacade::Summary::model(in_RDI);
      (**(code **)&(in_RDI->facade->ctx).output.preds_.ebo_.size)
                (in_RDI,in_stack_ffffffffffffffb8,pMVar3,0);
    }
  }
  else {
    pMVar3 = ClaspFacade::Summary::model(in_RDI);
    memcpy(local_38,pMVar3,0x28);
    local_18 = local_18 & 0xdfffffff;
    pSVar4 = ClaspFacade::Summary::ctx(local_10);
    (**(code **)&(in_RDI->facade->ctx).output.preds_.ebo_.size)(in_RDI,&pSVar4->output,local_38,1);
  }
  iVar2 = callQ((Output *)in_RDI);
  if (iVar2 == 0) {
    (**(code **)&(in_RDI->facade->ctx).output.projMode_)(in_RDI,local_10,0);
    bVar1 = stats((Output *)in_RDI,in_stack_ffffffffffffffb8);
    if (bVar1) {
      (*(code *)(in_RDI->facade->ctx).heuristic.assume)(in_RDI,local_10,0);
    }
  }
  else {
    iVar2 = callQ((Output *)in_RDI);
    if (iVar2 == 1) {
      in_RDI->unsatTime = (double)local_10;
    }
  }
  return;
}

Assistant:

void Output::stopStep(const ClaspFacade::Summary& s){
	if (s.model() && last_) {
		Model m = *s.model();
		m.up = 0; // ignore update state and always print as model
		printModel(s.ctx().output, m, print_best);
	}
	else if (modelQ() == print_all && s.model() && s.model()->up && !s.model()->def) {
		printModel(s.ctx().output, *s.model(), print_all);
	}
	if (callQ() == print_all) {
		printSummary(s, false);
		if (stats(s)) { printStatistics(s, false); }
	}
	else if (callQ() == print_best) {
		summary_ = &s;
	}
}